

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

void __thiscall
clickhouse::ColumnEnum<short>::ColumnEnum
          (ColumnEnum<short> *this,TypeRef *type,vector<short,_std::allocator<short>_> *data)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016b560;
    (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016b560;
    (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00138f2e;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00138f2e:
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnEnum_0016bc00;
  std::vector<short,_std::allocator<short>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnEnum<T>::ColumnEnum(TypeRef type, const std::vector<T>& data)
    : Column(type)
    , data_(data)
{
}